

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD4DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  DecodeStatus DVar6;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint align;
  uint inc;
  uint size;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  uint uVar7;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  fieldFromInstruction_4(in_ESI,0xc,4);
  fieldFromInstruction_4(in_ESI,0x16,1);
  fieldFromInstruction_4(in_ESI,0x10,4);
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,6,2);
  uVar4 = fieldFromInstruction_4(in_ESI,5,1);
  iVar5 = uVar4 + 1;
  uVar4 = fieldFromInstruction_4(in_ESI,4,1);
  if (uVar3 == 3) {
    if (uVar4 == 0) {
      return MCDisassembler_Fail;
    }
    uVar7 = 0x10;
  }
  else if (uVar3 == 2) {
    uVar7 = uVar4 << 3;
  }
  else {
    uVar3 = 1 << ((byte)uVar3 & 0x1f);
    uVar7 = uVar3 * 4 * uVar4;
  }
  DVar6 = DecodeDPRRegisterClass(in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(iVar5,uVar7))
  ;
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
  if (_Var1) {
    DVar6 = DecodeDPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(iVar5,uVar7));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
    if (_Var1) {
      DVar6 = DecodeDPRRegisterClass
                        (in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(iVar5,uVar7));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
      if (_Var1) {
        DVar6 = DecodeDPRRegisterClass
                          (in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(iVar5,uVar7));
        _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
        if (_Var1) {
          if (uVar2 != 0xf) {
            DVar6 = DecodeGPRRegisterClass
                              (in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(iVar5,uVar7));
            _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
            if (!_Var1) {
              return MCDisassembler_Fail;
            }
          }
          DVar6 = DecodeGPRRegisterClass
                            (in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(iVar5,uVar7));
          _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
          if (_Var1) {
            MCOperand_CreateImm0(in_RDI,(ulong)uVar7);
            if (uVar2 == 0xd) {
              MCOperand_CreateReg0(in_RDI,0);
            }
            else if (uVar2 != 0xf) {
              DVar6 = DecodeGPRRegisterClass
                                (in_RCX,local_4,CONCAT44(uVar2,uVar3),(void *)CONCAT44(iVar5,uVar7))
              ;
              _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar6);
              if (!_Var1) {
                local_4 = MCDisassembler_Fail;
              }
            }
          }
          else {
            local_4 = MCDisassembler_Fail;
          }
        }
        else {
          local_4 = MCDisassembler_Fail;
        }
      }
      else {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVLD4DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, size, inc, align;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	size = fieldFromInstruction_4(Insn, 6, 2);
	inc = fieldFromInstruction_4(Insn, 5, 1) + 1;
	align = fieldFromInstruction_4(Insn, 4, 1);

	if (size == 0x3) {
		if (align == 0)
			return MCDisassembler_Fail;
		align = 16;
	} else {
		if (size == 2) {
			align *= 8;
		} else {
			size = 1 << size;
			align *= 4 * size;
		}
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	if (Rm == 0xD)
		MCOperand_CreateReg0(Inst, 0);
	else if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}